

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_finite(REF_GRID ref_grid,REF_INT ldim,REF_DBL *field)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int local_24;
  
  uVar1 = ref_grid->node->max;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < ldim) {
    uVar4 = (ulong)(uint)ldim;
  }
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  local_24 = 0;
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    if (-1 < ref_grid->node->global[uVar3]) {
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        local_24 = local_24 + (uint)(0x7fefffffffffffff < (ulong)ABS(field[uVar5]));
      }
    }
    field = field + ldim;
  }
  uVar1 = ref_mpi_allsum(ref_grid->mpi,&local_24,1,1);
  if (uVar1 == 0) {
    if (local_24 < 1) {
      uVar1 = 0;
    }
    else {
      uVar1 = 3;
      if (ref_grid->mpi->id == 0) {
        printf("%d not finite\n");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
           0x213,"ref_validation_finite",(ulong)uVar1,"global");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_validation_finite(REF_GRID ref_grid, REF_INT ldim,
                                         REF_DBL *field) {
  REF_INT i, node, n;
  n = 0;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < ldim; i++) {
      if (!isfinite(field[i + ldim * node])) n++;
    }
  }
  RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), &n, 1, REF_INT_TYPE), "global");
  if (n > 0) {
    if (ref_mpi_once(ref_grid_mpi(ref_grid))) printf("%d not finite\n", n);
    return REF_INVALID;
  }
  return REF_SUCCESS;
}